

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O2

void map_object(obj *obj,int show)

{
  uint uVar1;
  obj *poVar2;
  boolean bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int x;
  int y;
  rm *prVar8;
  rm *loc_override;
  int iVar9;
  uint uVar10;
  rm tmp_loc;
  
  x = (int)obj->ox;
  y = (int)obj->oy;
  if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
     ((u.umonnum != u.umonster && (bVar3 = dmgtype(youmonst.data,0x24), bVar3 != '\0')))) {
    iVar9 = (int)obj->otyp;
  }
  else {
    iVar9 = display_rng(0x219);
    iVar9 = iVar9 + 1;
  }
  prVar8 = level->locations[x] + y;
  loc_override = prVar8;
  if (((level->flags).field_0x9 & 0x40) == 0) {
    loc_override = &tmp_loc;
    tmp_loc._8_4_ = *(undefined4 *)&level->locations[x][y].field_0x8;
    tmp_loc._0_4_ = *(undefined4 *)&prVar8->field_0x0;
    tmp_loc.typ = prVar8->typ;
    tmp_loc.seenv = prVar8->seenv;
    tmp_loc._6_2_ = *(undefined2 *)&prVar8->field_0x6;
  }
  if (((iVar9 == 0xf6) || (iVar9 == 0x215)) || (iVar4 = 0, iVar9 == 0x10e)) {
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((u.umonnum != u.umonster && (bVar3 = dmgtype(youmonst.data,0x24), bVar3 != '\0')))) {
      iVar4 = obfuscate_monster(obj->corpsenm);
    }
    else {
      iVar4 = display_rng(0x193);
    }
  }
  uVar10 = iVar9 * 0x800 + 0x800U & 0x1ff800;
  uVar1 = *(uint *)loc_override;
  uVar5 = iVar4 * 0x200000 + 0x200000U & 0x3fe00000;
  *(uint *)loc_override = uVar5 | uVar1 & 0xc00007ff | uVar10;
  uVar6 = 0;
  uVar7 = 0;
  if (obj->otyp != 0x214) {
    poVar2 = level->objects[x][y];
    uVar7 = 0;
    if (poVar2 != (obj *)0x0) {
      uVar7 = (uint)((poVar2->v).v_nexthere != (obj *)0x0) << 0x1e;
    }
  }
  *(uint *)loc_override = uVar5 | uVar1 & 0x800007ff | uVar10 | uVar7;
  if (((obj->field_0x4b & 0x20) != 0) && ((obj->otyp & 0xfffeU) != 0xda)) {
    uVar6 = (uint)(obj->otyp != 0xdc) << 0x1f;
  }
  *(uint *)loc_override = uVar5 | uVar1 & 0x7ff | uVar10 | uVar7 | uVar6;
  if (show != 0) {
    dbuf_set(level,x,y,loc_override,-1,-1,-1,-1,-1,-1,0,0,0,0);
  }
  return;
}

Assistant:

void map_object(struct obj *obj, int show)
{
    int x = obj->ox, y = obj->oy;
    int objtyp = what_obj(obj->otyp);
    int monnum = 0;
    struct rm *loc = &level->locations[x][y];
    struct rm tmp_loc;

    if (!level->flags.hero_memory) {
	tmp_loc = *loc;
	loc = &tmp_loc;
    }

    if (objtyp == CORPSE || objtyp == STATUE || objtyp == FIGURINE) {
	if (Hallucination)
	    monnum = random_monster();
	else
	    monnum = obfuscate_monster(obj->corpsenm);
    }
    loc->mem_obj = objtyp + 1;
    loc->mem_obj_mn = monnum + 1;
    loc->mem_obj_stacks = obj->otyp != BOULDER &&
			  level->objects[x][y] && level->objects[x][y]->nexthere;
    loc->mem_obj_prize = Is_prize(obj);

    if (show)
	dbuf_set(level, x, y, loc, -1, -1, -1, -1, -1, -1, 0, 0, 0, 0);
}